

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 ImGui::CalcTextSize(char *text,char *text_end,bool hide_text_after_double_hash,
                          float wrap_width)

{
  float size;
  ImFont *this;
  ImGuiContext *pIVar1;
  float character_spacing_x;
  float font_scale;
  float font_size;
  ImFont *font;
  char *text_display_end;
  ImGuiContext *g;
  float wrap_width_local;
  bool hide_text_after_double_hash_local;
  char *text_end_local;
  char *text_local;
  ImVec2 text_size;
  
  pIVar1 = GImGui;
  font = (ImFont *)text_end;
  if (hide_text_after_double_hash) {
    font = (ImFont *)FindRenderedTextEnd(text,text_end);
  }
  this = pIVar1->Font;
  size = pIVar1->FontSize;
  if ((ImFont *)text == font) {
    ImVec2::ImVec2((ImVec2 *)&text_local,0.0,size);
  }
  else {
    text_local = (char *)ImFont::CalcTextSizeA
                                   (this,size,3.4028235e+38,wrap_width,text,(char *)font,
                                    (char **)0x0);
    if (0.0 < text_local._0_4_) {
      text_local = (char *)CONCAT44(text_local._4_4_,
                                    text_local._0_4_ - (size / this->FontSize) * 1.0);
    }
    text_local = (char *)CONCAT44(text_local._4_4_,(float)(int)(text_local._0_4_ + 0.95));
  }
  return (ImVec2)text_local;
}

Assistant:

ImVec2 ImGui::CalcTextSize(const char* text, const char* text_end, bool hide_text_after_double_hash, float wrap_width)
{
    ImGuiContext& g = *GImGui;

    const char* text_display_end;
    if (hide_text_after_double_hash)
        text_display_end = FindRenderedTextEnd(text, text_end);      // Hide anything after a '##' string
    else
        text_display_end = text_end;

    ImFont* font = g.Font;
    const float font_size = g.FontSize;
    if (text == text_display_end)
        return ImVec2(0.0f, font_size);
    ImVec2 text_size = font->CalcTextSizeA(font_size, FLT_MAX, wrap_width, text, text_display_end, NULL);

    // Cancel out character spacing for the last character of a line (it is baked into glyph->XAdvance field)
    const float font_scale = font_size / font->FontSize;
    const float character_spacing_x = 1.0f * font_scale;
    if (text_size.x > 0.0f)
        text_size.x -= character_spacing_x;
    text_size.x = (float)(int)(text_size.x + 0.95f);

    return text_size;
}